

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O0

void __thiscall
pele::physics::pltfilemanager::PltFileManager::readLevelBoxArray
          (PltFileManager *this,int a_lev,BoxArray *a_grid)

{
  istream *is_00;
  Vector<char,_std::allocator<char>_> *in_RDX;
  undefined4 in_ESI;
  string line;
  istringstream is;
  string fileCharPtrString;
  Vector<char,_std::allocator<char>_> fileCharPtr;
  string lvlHeader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  allocator *paVar1;
  char *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffffd60;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffffd68;
  istringstream local_290 [8];
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  BoxArray *in_stack_fffffffffffffd80;
  allocator local_109;
  string local_108 [36];
  MPI_Comm local_e4;
  string local_c8 [48];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [16];
  MPI_Comm *in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe7;
  undefined4 in_stack_fffffffffffffff0;
  
  std::operator+(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  std::__cxx11::to_string(in_stack_fffffffffffffd7c);
  std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  std::operator+(in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  amrex::Vector<char,_std::allocator<char>_>::Vector
            ((Vector<char,_std::allocator<char>_> *)0xe3e903);
  local_e4 = amrex::ParallelDescriptor::Communicator();
  amrex::ParallelDescriptor::ReadAndBcastFile
            ((string *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
             (bool)in_stack_ffffffffffffffe7,in_stack_ffffffffffffffd8);
  is_00 = (istream *)
          amrex::Vector<char,_std::allocator<char>_>::dataPtr
                    ((Vector<char,_std::allocator<char>_> *)0xe3e93d);
  paVar1 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,(char *)is_00,paVar1);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::istringstream::istringstream(local_290,local_108,_S_in);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffd50);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_290,(string *)&stack0xfffffffffffffd50);
  GotoNextLine(is_00);
  GotoNextLine(is_00);
  GotoNextLine(is_00);
  amrex::BoxArray::readFrom
            (in_stack_fffffffffffffd80,
             (istream *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd50);
  std::__cxx11::istringstream::~istringstream(local_290);
  std::__cxx11::string::~string(local_108);
  amrex::Vector<char,_std::allocator<char>_>::~Vector
            ((Vector<char,_std::allocator<char>_> *)0xe3ea17);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void
PltFileManager::readLevelBoxArray(int a_lev, BoxArray& a_grid)
{
  const std::string lvlHeader(
    m_pltFile + "/" + level_prefix + std::to_string(a_lev) + "/Cell_H");

  Vector<char> fileCharPtr;
  ParallelDescriptor::ReadAndBcastFile(lvlHeader, fileCharPtr);
  std::string fileCharPtrString(fileCharPtr.dataPtr());
  std::istringstream is(fileCharPtrString, std::istringstream::in);

  std::string line;

  std::getline(is, line); // Skip
  GotoNextLine(is);       // Skip
  GotoNextLine(is);       // Skip
  GotoNextLine(is);       // Skip
  a_grid.readFrom(is);
}